

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamclient.cpp
# Opt level: O0

int __thiscall
hbm::streaming::StreamClient::start
          (StreamClient *this,string *address,string *streamPort,string *controlPort)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  ssize_t sVar4;
  socklen_t __len;
  string *in_RCX;
  sockaddr *in_RDX;
  string *in_RSI;
  SocketNonblocking *in_RDI;
  Value *params;
  string method;
  Value *content;
  MetaInformation metaInformation;
  size_t bytesProcessedFromBuffer;
  ssize_t bytesReadToBuffer;
  size_t bytesToReadToBuffer;
  size_t bytesInBuffer;
  uint signalNumber;
  size_t bytesToProcess;
  int type;
  TransportHeader transportHeader;
  uchar dataRecvBuffer [8192];
  int result;
  MetaInformation *in_stack_ffffffffffffde38;
  MetaInformation *in_stack_ffffffffffffde40;
  char *in_stack_ffffffffffffde50;
  undefined4 in_stack_ffffffffffffde58;
  int in_stack_ffffffffffffde5c;
  ostream *in_stack_ffffffffffffde68;
  Value *in_stack_ffffffffffffde70;
  SocketNonblocking *in_stack_ffffffffffffde78;
  string local_2150 [16];
  size_t in_stack_ffffffffffffdec0;
  uchar *in_stack_ffffffffffffdec8;
  uint in_stack_ffffffffffffded4;
  SignalContainer *in_stack_ffffffffffffded8;
  undefined1 local_2100 [152];
  undefined1 local_2068 [176];
  Value *in_stack_ffffffffffffe048;
  string *in_stack_ffffffffffffe050;
  StreamClient *in_stack_ffffffffffffe058;
  size_t in_stack_ffffffffffffe080;
  SocketNonblocking *in_stack_ffffffffffffe088;
  MetaInformation *in_stack_ffffffffffffe090;
  Value *in_stack_ffffffffffffe318;
  string *in_stack_ffffffffffffe320;
  uint in_stack_ffffffffffffe32c;
  SignalContainer *in_stack_ffffffffffffe330;
  allocator local_51;
  string local_50 [36];
  int local_2c;
  string *local_28;
  sockaddr *local_20;
  string *local_18;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  __len = (socklen_t)in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,pcVar2,&local_51);
  iVar1 = SocketNonblocking::connect(in_RDI,(int)local_50,local_20,__len);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_2c = iVar1;
  if (iVar1 < 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"could not connect to streming port ");
    poVar3 = std::operator<<(poVar3,local_18);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = std::operator<<(poVar3,(string *)local_20);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_4 = -1;
  }
  else {
    std::__cxx11::string::operator=((string *)(in_RDI + 1),local_18);
    std::__cxx11::string::operator=
              ((string *)(in_RDI[1].m_bufferedReader.m_buffer + 0x50),(string *)local_20);
    std::__cxx11::string::operator=((string *)(in_RDI[1].m_bufferedReader.m_buffer + 0x70),local_28)
    ;
    TransportHeader::TransportHeader((TransportHeader *)(local_2100 + 0x80),in_RDI);
LAB_0013c830:
    sVar4 = TransportHeader::receive
                      ((TransportHeader *)
                       CONCAT44(in_stack_ffffffffffffde5c,in_stack_ffffffffffffde58));
    local_2c = (int)sVar4;
    if (-1 < local_2c) {
      local_2100._124_4_ = TransportHeader::type((TransportHeader *)(local_2100 + 0x80));
      local_2100._112_8_ = TransportHeader::size((TransportHeader *)(local_2100 + 0x80));
      local_2100._108_4_ = TransportHeader::signalNumber((TransportHeader *)(local_2100 + 0x80));
      if (local_2100._124_4_ == TYPE_DATA) {
        local_2100._96_8_ = 0;
        while (local_2100._112_8_ != 0) {
          if ((ulong)local_2100._112_8_ < 0x2001) {
            local_2100._88_8_ = local_2100._112_8_ - local_2100._96_8_;
          }
          else {
            local_2100._88_8_ = 0x2000 - local_2100._96_8_;
          }
          local_2100._80_8_ =
               SocketNonblocking::receiveComplete
                         (in_stack_ffffffffffffde78,in_stack_ffffffffffffde70,
                          (size_t)in_stack_ffffffffffffde68);
          if ((long)local_2100._80_8_ < 1) break;
          local_2100._96_8_ = local_2100._80_8_ + local_2100._96_8_;
          if (*(long *)(in_RDI[1].m_bufferedReader.m_buffer + 0xe8) == 0) {
            local_2100._112_8_ = local_2100._112_8_ - local_2100._96_8_;
            local_2100._96_8_ = 0;
          }
          else {
            local_2100._72_8_ =
                 SignalContainer::processMeasuredData
                           (in_stack_ffffffffffffded8,in_stack_ffffffffffffded4,
                            in_stack_ffffffffffffdec8,in_stack_ffffffffffffdec0);
            local_2100._112_8_ = local_2100._112_8_ - local_2100._72_8_;
            local_2100._96_8_ = local_2100._96_8_ - local_2100._72_8_;
            memmove(local_2068,local_2068 + local_2100._72_8_,local_2100._96_8_);
          }
        }
      }
      else if (local_2100._124_4_ == TYPE_META) {
        in_stack_ffffffffffffde78 = (SocketNonblocking *)local_2100;
        MetaInformation::MetaInformation
                  (in_stack_ffffffffffffe090,in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
        iVar1 = MetaInformation::type((MetaInformation *)in_stack_ffffffffffffde78);
        if (iVar1 == 1) {
          MetaInformation::jsonContent(in_stack_ffffffffffffde38);
          Json::Value::operator[]
                    ((Value *)CONCAT44(in_stack_ffffffffffffde5c,in_stack_ffffffffffffde58),
                     in_stack_ffffffffffffde50);
          Json::Value::asString_abi_cxx11_((Value *)in_stack_ffffffffffffe058);
          in_stack_ffffffffffffde40 =
               (MetaInformation *)
               Json::Value::operator[]
                         ((Value *)CONCAT44(in_stack_ffffffffffffde5c,in_stack_ffffffffffffde58),
                          in_stack_ffffffffffffde50);
          if (local_2100._108_4_ == 0) {
            processStreamMetaInformation
                      (in_stack_ffffffffffffe058,in_stack_ffffffffffffe050,in_stack_ffffffffffffe048
                      );
          }
          else if (*(long *)(in_RDI[1].m_bufferedReader.m_buffer + 0xe8) != 0) {
            SignalContainer::processMetaInformation
                      (in_stack_ffffffffffffe330,in_stack_ffffffffffffe32c,in_stack_ffffffffffffe320
                       ,in_stack_ffffffffffffe318);
          }
          std::__cxx11::string::~string(local_2150);
          Json::Value::~Value(in_stack_ffffffffffffde70);
        }
        else {
          in_stack_ffffffffffffde70 =
               (Value *)std::operator<<((ostream *)&std::cout,"Signal number ");
          in_stack_ffffffffffffde68 =
               (ostream *)std::ostream::operator<<(in_stack_ffffffffffffde70,local_2100._108_4_);
          poVar3 = std::operator<<(in_stack_ffffffffffffde68,": unhandled meta information of type "
                                  );
          in_stack_ffffffffffffde5c = MetaInformation::type((MetaInformation *)local_2100);
          in_stack_ffffffffffffde50 =
               (char *)std::ostream::operator<<(poVar3,in_stack_ffffffffffffde5c);
          std::ostream::operator<<(in_stack_ffffffffffffde50,std::endl<char,std::char_traits<char>>)
          ;
        }
        MetaInformation::~MetaInformation(in_stack_ffffffffffffde40);
      }
      goto LAB_0013c830;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"stream client ");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 1));
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI[1].m_bufferedReader.m_buffer + 0x50));
    poVar3 = std::operator<<(poVar3," stopped");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

int StreamClient::start(const std::string& address, const std::string &streamPort, const std::string& controlPort)
		{
			int result = m_streamSocket.connect(address.c_str(), streamPort);
			if (result < 0) {
				std::cerr << "could not connect to streming port " << address << ":" << streamPort << std::endl;
				return -1;
			}

			m_address = address;
			m_streamPort = streamPort;
			m_controlPort = controlPort;

			unsigned char dataRecvBuffer[8192];

			TransportHeader transportHeader(m_streamSocket);
			do {
				result = transportHeader.receive();
				if (result < 0) {
					break;
				}
				int type = transportHeader.type();
				size_t bytesToProcess = transportHeader.size();
				unsigned int signalNumber = transportHeader.signalNumber();

				if (type == TYPE_DATA) {
					// read and process measured data. This happens really often! Be sure to be as efficient as possible here.

					size_t bytesInBuffer = 0;
					size_t bytesToReadToBuffer;
					while(bytesToProcess>0) {
						if(bytesToProcess>sizeof(dataRecvBuffer)) {
							bytesToReadToBuffer = sizeof(dataRecvBuffer)-bytesInBuffer;
						} else {
							bytesToReadToBuffer = bytesToProcess-bytesInBuffer;
						}
						ssize_t bytesReadToBuffer = m_streamSocket.receiveComplete(dataRecvBuffer+bytesInBuffer, bytesToReadToBuffer);
						if(bytesReadToBuffer<=0) {
							break;
						}
						bytesInBuffer += bytesReadToBuffer;

						if (m_pSignalContainer) {
							size_t bytesProcessedFromBuffer = m_pSignalContainer->processMeasuredData(signalNumber, dataRecvBuffer, bytesInBuffer);
							bytesToProcess -= bytesProcessedFromBuffer;
							bytesInBuffer -= bytesProcessedFromBuffer;
							memmove(dataRecvBuffer, dataRecvBuffer+bytesProcessedFromBuffer, bytesInBuffer);
						} else {
							bytesToProcess -= bytesInBuffer;
							bytesInBuffer = 0;
						}
					}
				} else if (type == TYPE_META){
					MetaInformation metaInformation(m_streamSocket, bytesToProcess);
					if(metaInformation.type()!=METAINFORMATION_JSON) {
						std::cout << "Signal number " << signalNumber << ": unhandled meta information of type " << metaInformation.type() << std::endl;
					} else {
						const Json::Value& content = metaInformation.jsonContent();
						std::string method = content[METHOD].asString();
						const Json::Value& params = content[PARAMS];

						if (signalNumber == 0) {
							// stream related meta information
							processStreamMetaInformation(method, params);
						} else {
							// signal related meta information
							if (m_pSignalContainer) {
								m_pSignalContainer->processMetaInformation(signalNumber, method, params);
							}
						}
					}
				}
			} while(true);
			
			std::cout << "stream client " << m_address << ":" << m_streamPort << " stopped" << std::endl;

			return result;
		}